

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ktx2ktx2.cpp
# Opt level: O0

int __thiscall ktxUpgrader::main(ktxUpgrader *this,int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  reference pbVar3;
  long lVar4;
  int *piVar5;
  ostream *poVar6;
  char *pcVar7;
  undefined8 uVar8;
  long *in_RDI;
  stringstream writer;
  char *orientation;
  uint orientLen;
  char *key;
  uint keyLen;
  ktxHashListEntry *pEntry;
  char answer;
  bool force;
  size_t dot;
  string outfile;
  string infile;
  const_iterator it;
  int exitCode;
  ktxTexture1 *texture;
  ktx_error_code_e result;
  FILE *outf;
  FILE *inf;
  string *in_stack_fffffffffffffb18;
  string *in_stack_fffffffffffffb20;
  ostream *in_stack_fffffffffffffb28;
  allocator<char> *in_stack_fffffffffffffb30;
  ostream *in_stack_fffffffffffffb38;
  ktxApp *in_stack_fffffffffffffb40;
  ostream *in_stack_fffffffffffffb50;
  ostream *in_stack_fffffffffffffb58;
  char *in_stack_fffffffffffffb60;
  string *in_stack_fffffffffffffbf0;
  undefined8 in_stack_fffffffffffffc28;
  char **in_stack_fffffffffffffc30;
  int in_stack_fffffffffffffc3c;
  ktxApp *in_stack_fffffffffffffc40;
  allocator<char> local_371;
  string local_370 [32];
  int local_350;
  allocator<char> local_349;
  string local_348 [32];
  string local_328 [32];
  string local_308 [32];
  stringstream local_2e8 [392];
  undefined8 local_160;
  undefined4 local_154;
  char *local_150;
  undefined1 local_144 [4];
  long local_140;
  undefined1 local_131 [40];
  allocator<char> local_109;
  string local_108 [38];
  char local_e2;
  byte local_e1;
  ulong local_e0;
  allocator<char> local_c1;
  string local_c0 [32];
  string local_a0 [32];
  string local_80 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_50;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_48;
  int local_3c;
  long local_38;
  int local_2c;
  FILE *local_28;
  FILE *local_20;
  
  local_28 = (FILE *)0x0;
  local_38 = 0;
  local_3c = 0;
  ktxApp::processCommandLine
            (in_stack_fffffffffffffc40,in_stack_fffffffffffffc3c,in_stack_fffffffffffffc30,
             (StdinUse)((ulong)in_stack_fffffffffffffc28 >> 0x20),
             (OutfilePos)in_stack_fffffffffffffc28);
  (**(code **)(*in_RDI + 0x20))();
  __gnu_cxx::
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::__normal_iterator(&local_48);
  local_58 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_fffffffffffffb18);
  __gnu_cxx::
  __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
  ::__normal_iterator<std::__cxx11::string*>
            ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)in_stack_fffffffffffffb20,
             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)in_stack_fffffffffffffb18);
  local_48._M_current = local_50;
  while( true ) {
    local_60 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_fffffffffffffb18);
    bVar1 = __gnu_cxx::operator<
                      ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)in_stack_fffffffffffffb20,
                       (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)in_stack_fffffffffffffb18);
    if (!bVar1) {
      return local_3c;
    }
    pbVar3 = __gnu_cxx::
             __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&local_48);
    std::__cxx11::string::string(local_80,(string *)pbVar3);
    std::__cxx11::string::string(local_a0);
    iVar2 = std::__cxx11::string::compare((char *)local_80);
    if (iVar2 == 0) {
      local_20 = _stdin;
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffb60,(char *)in_stack_fffffffffffffb58,
                 (allocator<char> *)in_stack_fffffffffffffb50);
      local_20 = (FILE *)fopenUTF8(in_stack_fffffffffffffb20,in_stack_fffffffffffffb18);
      std::__cxx11::string::~string(local_c0);
      std::allocator<char>::~allocator(&local_c1);
    }
    if (local_20 == (FILE *)0x0) {
      in_stack_fffffffffffffb40 =
           (ktxApp *)std::operator<<((ostream *)&std::cerr,(string *)(in_RDI + 1));
      in_stack_fffffffffffffb38 =
           std::operator<<((ostream *)in_stack_fffffffffffffb40," could not open input file \"");
      iVar2 = std::__cxx11::string::compare((char *)local_80);
      if (iVar2 == 0) {
        in_stack_fffffffffffffb30 = &local_371;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffb60,(char *)in_stack_fffffffffffffb58,
                   (allocator<char> *)in_stack_fffffffffffffb50);
      }
      else {
        std::__cxx11::string::string(local_370,local_80);
      }
      in_stack_fffffffffffffb28 = std::operator<<(in_stack_fffffffffffffb38,local_370);
      in_stack_fffffffffffffb20 = (string *)std::operator<<(in_stack_fffffffffffffb28,"\". ");
      piVar5 = __errno_location();
      pcVar7 = strerror(*piVar5);
      in_stack_fffffffffffffb18 =
           (string *)std::operator<<((ostream *)in_stack_fffffffffffffb20,pcVar7);
      std::ostream::operator<<
                ((ostream *)in_stack_fffffffffffffb18,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string(local_370);
      if (iVar2 == 0) {
        std::allocator<char>::~allocator(&local_371);
      }
      local_3c = 2;
      local_350 = 5;
    }
    else {
      iVar2 = std::__cxx11::string::compare((char *)local_80);
      if (((iVar2 == 0) || ((*(byte *)((long)in_RDI + 0xbc) & 1) != 0)) ||
         (lVar4 = std::__cxx11::string::length(), lVar4 != 0)) {
        lVar4 = std::__cxx11::string::length();
        if (lVar4 != 0) {
          std::__cxx11::string::operator=(local_a0,(string *)(in_RDI + 0x12));
        }
      }
      else {
        std::__cxx11::string::operator=(local_a0,local_80);
        local_e0 = std::__cxx11::string::find_last_of((char)local_a0,0x2e);
        if (local_e0 != 0xffffffffffffffff) {
          std::__cxx11::string::erase((ulong)local_a0,local_e0);
        }
        std::__cxx11::string::operator+=(local_a0,".ktx2");
      }
      if ((*(byte *)((long)in_RDI + 0xbc) & 1) == 0) {
        lVar4 = std::__cxx11::string::length();
        if (lVar4 != 0) {
          local_28 = (FILE *)ktxApp::fopen_write_if_not_exists(in_stack_fffffffffffffbf0);
        }
      }
      else {
        local_28 = _stdout;
      }
      if ((local_28 == (FILE *)0x0) && (piVar5 = __errno_location(), *piVar5 == 0x11)) {
        local_e1 = *(byte *)((long)in_RDI + 0xbd) & 1;
        if (local_e1 == 0) {
          iVar2 = fileno(_stdin);
          iVar2 = isatty(iVar2);
          if (iVar2 != 0) {
            poVar6 = std::operator<<((ostream *)&std::cout,"Output file ");
            poVar6 = std::operator<<(poVar6,(string *)(in_RDI + 0x12));
            std::operator<<(poVar6," exists. Overwrite? [Y or n] ");
            std::operator>>((istream *)&std::cin,&local_e2);
            if (local_e2 == 'Y') {
              local_e1 = 1;
            }
          }
        }
        if ((local_e1 & 1) != 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffb60,(char *)in_stack_fffffffffffffb58,
                     (allocator<char> *)in_stack_fffffffffffffb50);
          local_28 = (FILE *)fopenUTF8(in_stack_fffffffffffffb20,in_stack_fffffffffffffb18);
          std::__cxx11::string::~string(local_108);
          std::allocator<char>::~allocator(&local_109);
        }
      }
      if (local_28 == (FILE *)0x0) {
        poVar6 = std::operator<<((ostream *)&std::cerr,(string *)(in_RDI + 1));
        poVar6 = std::operator<<(poVar6," could not open output file \"");
        lVar4 = std::__cxx11::string::length();
        if (lVar4 == 0) {
          in_stack_fffffffffffffb60 = "stdout";
        }
        else {
          in_stack_fffffffffffffb60 = (char *)std::__cxx11::string::c_str();
        }
        in_stack_fffffffffffffb58 = std::operator<<(poVar6,in_stack_fffffffffffffb60);
        in_stack_fffffffffffffb50 = std::operator<<(in_stack_fffffffffffffb58,"\". ");
        piVar5 = __errno_location();
        pcVar7 = strerror(*piVar5);
        poVar6 = std::operator<<(in_stack_fffffffffffffb50,pcVar7);
        std::ostream::operator<<((ostream *)poVar6,std::endl<char,std::char_traits<char>>);
        local_3c = 2;
        local_350 = 5;
      }
      else {
        local_2c = ktxTexture1_CreateFromStdioStream(local_20,1,&local_38);
        if (local_2c == 0) {
          local_2c = 0;
          for (local_140 = *(long *)(local_38 + 0x50); local_140 != 0;
              local_140 = ktxHashList_Next(local_140)) {
            ktxHashListEntry_GetKey(local_140,local_144,&local_150);
            iVar2 = strncasecmp(local_150,"KTX",3);
            if (((iVar2 == 0) && (iVar2 = strcmp(local_150,"KTXorientation"), iVar2 != 0)) &&
               (iVar2 = strcmp(local_150,"KTXwriter"), iVar2 != 0)) {
              iVar2 = strcmp(local_150,"KTXOrientation");
              if ((iVar2 == 0) && ((*(byte *)((long)in_RDI + 0xbe) & 1) != 0)) {
                ktxHashListEntry_GetValue(local_140,&local_154,&local_160);
                ktxHashList_AddKVPair(local_38 + 0x50,"KTXorientation",local_154,local_160);
              }
              else {
                poVar6 = std::operator<<((ostream *)&std::cerr,(string *)(in_RDI + 1));
                poVar6 = std::operator<<(poVar6,": Warning: Dropping unrecognized ");
                poVar6 = std::operator<<(poVar6,"metadata \"");
                poVar6 = std::operator<<(poVar6,local_150);
                poVar6 = std::operator<<(poVar6,"\"");
                std::ostream::operator<<((ostream *)poVar6,std::endl<char,std::char_traits<char>>);
              }
              ktxHashList_DeleteEntry(local_38 + 0x50,local_140);
            }
          }
          std::__cxx11::stringstream::stringstream(local_2e8);
          ktxApp::writeId(in_stack_fffffffffffffb40,in_stack_fffffffffffffb38,
                          SUB81((ulong)in_stack_fffffffffffffb30 >> 0x38,0));
          lVar4 = local_38 + 0x50;
          std::__cxx11::stringstream::str();
          iVar2 = std::__cxx11::string::length();
          std::__cxx11::stringstream::str();
          uVar8 = std::__cxx11::string::c_str();
          ktxHashList_AddKVPair(lVar4,"KTXwriter",iVar2 + 1,uVar8);
          std::__cxx11::string::~string(local_328);
          std::__cxx11::string::~string(local_308);
          local_2c = ktxTexture1_WriteKTX2ToStdioStream(local_38,local_28);
          (*(code *)**(undefined8 **)(local_38 + 8))();
          fclose(local_20);
          fclose(local_28);
          if (local_2c == 0) {
            local_350 = 0;
          }
          else {
            poVar6 = std::operator<<((ostream *)&std::cerr,(string *)(in_RDI + 1));
            poVar6 = std::operator<<(poVar6," failed to write KTX2 file; ");
            pcVar7 = (char *)ktxErrorString(local_2c);
            poVar6 = std::operator<<(poVar6,pcVar7);
            std::ostream::operator<<((ostream *)poVar6,std::endl<char,std::char_traits<char>>);
            std::__cxx11::string::c_str();
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffffb60,(char *)in_stack_fffffffffffffb58,
                       (allocator<char> *)in_stack_fffffffffffffb50);
            unlinkUTF8((string *)0x107977);
            std::__cxx11::string::~string(local_348);
            std::allocator<char>::~allocator(&local_349);
            local_3c = 2;
            local_350 = 5;
          }
          std::__cxx11::stringstream::~stringstream(local_2e8);
          if (local_350 == 0) {
            local_350 = 0;
          }
        }
        else {
          if (local_2c == 0xf) {
            poVar6 = std::operator<<((ostream *)&std::cerr,local_80);
            poVar6 = std::operator<<(poVar6," is not a KTX v1 file.");
            std::ostream::operator<<((ostream *)poVar6,std::endl<char,std::char_traits<char>>);
          }
          else if (local_2c != 0) {
            poVar6 = std::operator<<((ostream *)&std::cerr,(string *)(in_RDI + 1));
            poVar6 = std::operator<<(poVar6," failed to create ktxTexture from ");
            poVar6 = std::operator<<(poVar6,local_80);
            poVar6 = std::operator<<(poVar6,": ");
            pcVar7 = (char *)ktxErrorString(local_2c);
            poVar6 = std::operator<<(poVar6,pcVar7);
            std::ostream::operator<<((ostream *)poVar6,std::endl<char,std::char_traits<char>>);
          }
          fclose(local_20);
          fclose(local_28);
          std::__cxx11::string::c_str();
          in_stack_fffffffffffffbf0 = (string *)local_131;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffb60,(char *)in_stack_fffffffffffffb58,
                     (allocator<char> *)in_stack_fffffffffffffb50);
          unlinkUTF8((string *)0x1074d4);
          std::__cxx11::string::~string((string *)(local_131 + 1));
          std::allocator<char>::~allocator((allocator<char> *)local_131);
          local_3c = 2;
          local_350 = 5;
        }
      }
    }
    std::__cxx11::string::~string(local_a0);
    std::__cxx11::string::~string(local_80);
    if (local_350 != 0) break;
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)in_stack_fffffffffffffb28,(int)((ulong)in_stack_fffffffffffffb20 >> 0x20));
  }
  return local_3c;
}

Assistant:

int
ktxUpgrader::main(int argc, char* argv[])
{
    FILE *inf, *outf = nullptr;
    KTX_error_code result;
    ktxTexture1* texture = 0;
    int exitCode = 0;

    processCommandLine(argc, argv);
    validateOptions();

    std::vector<string>::const_iterator it;
    for (it = options.infiles.begin(); it < options.infiles.end(); it++) {
       string infile = *it;
       string outfile;

        if (infile.compare("-") == 0) {
            inf = stdin;
#if defined(_WIN32)
            /* Set "stdin" to have binary mode */
            (void)_setmode( _fileno( stdin ), _O_BINARY );
#endif
        } else {
            inf = fopenUTF8(infile, "rb");
        }

        if (inf) {
            if (infile.compare("-")
                && !options.useStdout && !options.outfile.length())
            {
                size_t dot;

                outfile = infile;
                dot = outfile.find_last_of('.');
                if (dot !=string::npos) {
                    outfile.erase(dot,string::npos);
                }
                outfile += ".ktx2";
            } else if (options.outfile.length()) {
                outfile = options.outfile;
            }

            if (options.useStdout) {
                outf = stdout;
#if defined(_WIN32)
                /* Set "stdout" to have binary mode */
                (void)_setmode( _fileno( stdout ), _O_BINARY );
#endif
            } else if (outfile.length()) {
                outf = fopen_write_if_not_exists(outfile);
            }

            if (!outf && errno == EEXIST) {
                bool force = options.force;
                if (!force) {
                    if (isatty(fileno(stdin))) {
                        char answer;
                        cout << "Output file " << options.outfile
                             << " exists. Overwrite? [Y or n] ";
                        cin >> answer;
                        if (answer == 'Y') {
                            force = true;
                        }
                    }
                }
                if (force) {
                    outf = fopenUTF8(outfile, "wb");
                }
            }

            if (outf) {
                result = ktxTexture1_CreateFromStdioStream(inf,
                                        KTX_TEXTURE_CREATE_LOAD_IMAGE_DATA_BIT,
                                        &texture);
                if (result != KTX_SUCCESS) {
                    if (result == KTX_UNKNOWN_FILE_FORMAT) {
                        cerr << infile << " is not a KTX v1 file." << endl;
                    } else if (result != KTX_SUCCESS) {
                        cerr << name
                             << " failed to create ktxTexture from " << infile
                             << ": " << ktxErrorString(result) << endl;
                    }
                    (void)fclose(inf);
                    (void)fclose(outf);
                    (void)unlinkUTF8(options.outfile.c_str());
                    exitCode = 2;
                    goto cleanup;
                }

                // Some in-the-wild KTX files have incorrect KTXOrientation
                // Warn about dropping invalid metadata.
                ktxHashListEntry* pEntry;
                for (pEntry = texture->kvDataHead;
                     pEntry != NULL;
                     pEntry = ktxHashList_Next(pEntry)) {
                    unsigned int keyLen;
                    char* key;

                    ktxHashListEntry_GetKey(pEntry, &keyLen, &key);
                    if (strncasecmp(key, "KTX", 3) == 0) {
                        if (strcmp(key, KTX_ORIENTATION_KEY)
                            && strcmp(key, KTX_WRITER_KEY)) {
                            if (strcmp(key, "KTXOrientation") == 0
                                && options.rewriteBadOrientation) {
                                    unsigned int orientLen;
                                    char* orientation;
                                    ktxHashListEntry_GetValue(pEntry,
                                                        &orientLen,
                                                        (void**)&orientation);
                                    ktxHashList_AddKVPair(&texture->kvDataHead,
                                                          KTX_ORIENTATION_KEY,
                                                          orientLen,
                                                          orientation);
                           } else {
                                cerr << name
                                     << ": Warning: Dropping unrecognized "
                                     << "metadata \"" << key << "\""
                                     << std::endl;
                            }
                            ktxHashList_DeleteEntry(&texture->kvDataHead,
                                                    pEntry);
                        }
                    }
                }

                // Add required writer metadata.
                std::stringstream writer;
                writeId(writer, options.test != 0);
                ktxHashList_AddKVPair(&texture->kvDataHead, KTX_WRITER_KEY,
                                      (ktx_uint32_t)writer.str().length() + 1,
                                      writer.str().c_str());

                result = ktxTexture1_WriteKTX2ToStdioStream(texture, outf);
                ktxTexture_Destroy(ktxTexture(texture));
                (void)fclose(inf);
                (void)fclose(outf);
                if (result != KTX_SUCCESS) {
                    cerr << name
                         << " failed to write KTX2 file; "
                         << ktxErrorString(result) << endl;
                    (void)unlinkUTF8(options.outfile.c_str());
                    exitCode = 2;
                    goto cleanup;
                }
            } else {
                cerr << name
                     << " could not open output file \""
                     << (options.outfile.length() ? options.outfile.c_str()
                                                  : "stdout")
                     << "\". " << strerror(errno) << endl;
                exitCode = 2;
                goto cleanup;
            }
        } else {
            cerr << name
                 << " could not open input file \""
                 << (infile.compare("-") ? infile : "stdin") << "\". "
                 << strerror(errno) << endl;
            exitCode = 2;
            goto cleanup;
        }
    }

cleanup:
    return exitCode;
}